

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_scalingFactorBetweenSameUnits_Test::~Units_scalingFactorBetweenSameUnits_Test
          (Units_scalingFactorBetweenSameUnits_Test *this)

{
  Units_scalingFactorBetweenSameUnits_Test *this_local;
  
  ~Units_scalingFactorBetweenSameUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, scalingFactorBetweenSameUnits)
{
    auto model = libcellml::Model::create("model");
    auto u1 = libcellml::Units::create("u1");
    auto u2 = libcellml::Units::create("u2");
    u1->addUnit("u2");
    model->addUnits(u1);
    model->addUnits(u2);
    auto scaling = libcellml::Units::scalingFactor(u1, u1);
    EXPECT_EQ(1.0, scaling);
}